

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O3

bool __thiscall rw::Light::streamWrite(Light *this,Stream *stream)

{
  int iVar1;
  float __x;
  undefined8 local_28;
  undefined8 uStack_20;
  float32 local_18;
  uint local_14;
  
  iVar1 = PluginList::streamGetSize((PluginList *)&s_plglist,this);
  writeChunkHeader(stream,0x12,iVar1 + 0x30);
  writeChunkHeader(stream,1,0x18);
  local_28._0_4_ = this->radius;
  local_28._4_4_ = (this->color).red;
  uStack_20._0_4_ = (this->color).green;
  uStack_20._4_4_ = (this->color).blue;
  local_18 = this->minusCosAngle;
  if (version < 0x30300) {
    __x = acosf(-(float)local_18);
    local_18 = (float32)tanf(__x);
  }
  local_14 = (uint)(this->object).object.subType << 0x10 | (uint)(this->object).object.flags;
  Stream::write32(stream,&local_28,0x18);
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return true;
}

Assistant:

bool
Light::streamWrite(Stream *stream)
{
	LightChunkData buf;
	writeChunkHeader(stream, ID_LIGHT, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, sizeof(LightChunkData));
	buf.radius = this->radius;
	buf.red   = this->color.red;
	buf.green = this->color.green;
	buf.blue  = this->color.blue;
	if(version >= 0x30300)
		buf.minusCosAngle = this->minusCosAngle;
	else
		buf.minusCosAngle = tanf(acosf(-this->minusCosAngle));
	buf.type_flags = (uint32)this->object.object.flags |
		(uint32)this->object.object.subType << 16;
	stream->write32(&buf, sizeof(LightChunkData));

	s_plglist.streamWrite(stream, this);
	return true;
}